

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void stbi__idct_block(stbi_uc *out,int out_stride,short *data)

{
  uint uVar1;
  long lVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int aiStack_218 [8];
  int aiStack_1f8 [8];
  int aiStack_1d8 [8];
  int aiStack_1b8 [8];
  int aiStack_198 [8];
  int aiStack_178 [8];
  int local_158 [2];
  undefined8 local_150;
  int aiStack_148 [20];
  int aiStack_f8 [8];
  int local_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  lVar2 = 0x38;
  do {
    if ((int)lVar2 == 0x40) {
      local_150 = out + 7;
      for (lVar2 = 0x1c; (int)lVar2 != 0x11c; lVar2 = lVar2 + 0x20) {
        iVar10 = *(int *)((long)aiStack_148 + lVar2 + -4);
        iVar4 = *(int *)((long)aiStack_148 + lVar2 + 0xc);
        iVar15 = (iVar4 + iVar10) * 0x8a9;
        iVar17 = iVar4 * -0x1d8f + iVar15;
        iVar15 = iVar10 * 0xc3f + iVar15;
        iVar10 = *(int *)((long)aiStack_148 + lVar2 + 4);
        iVar4 = *(int *)((long)local_158 + lVar2 + 4);
        iVar5 = *(int *)((long)aiStack_148 + lVar2 + -8);
        iVar6 = *(int *)((long)aiStack_148 + lVar2 + 0x10);
        iVar7 = *(int *)((long)aiStack_148 + lVar2 + 8);
        iVar14 = *(int *)((long)aiStack_148 + lVar2);
        iVar16 = (iVar5 + iVar7 + iVar14 + iVar6) * 0x12d0;
        iVar13 = (iVar5 + iVar6) * -0xe65 + iVar16;
        iVar16 = (iVar14 + iVar7) * -0x2901 + iVar16;
        iVar12 = (iVar5 + iVar7) * -0x63d;
        iVar11 = (iVar14 + iVar6) * -0x1f62;
        iVar14 = iVar14 * 0x312a + iVar11 + iVar16;
        iVar16 = iVar7 * 0x20da + iVar12 + iVar16;
        iVar7 = (iVar10 + iVar4) * 0x1000;
        iVar10 = (iVar4 - iVar10) * 0x1000;
        iVar4 = iVar7 - iVar15;
        iVar5 = iVar5 * 0x1805 + iVar12 + iVar13;
        iVar13 = iVar6 * 0x4c7 + iVar11 + iVar13;
        iVar6 = iVar10 - iVar17;
        iVar15 = iVar7 + 0x1010000 + iVar15;
        iVar17 = iVar10 + 0x1010000 + iVar17;
        uVar1 = iVar15 + iVar5 >> 0x11;
        uVar8 = (uint)(byte)-(-1 < (int)uVar1);
        if (uVar1 < 0x100) {
          uVar8 = uVar1;
        }
        uVar9 = iVar15 - iVar5 >> 0x11;
        uVar1 = (uint)(byte)-(-1 < (int)uVar9);
        if (uVar9 < 0x100) {
          uVar1 = uVar9;
        }
        local_150[-7] = (stbi_uc)uVar8;
        *local_150 = (stbi_uc)uVar1;
        uVar1 = iVar14 + iVar17 >> 0x11;
        uVar8 = (uint)(byte)-(-1 < (int)uVar1);
        if (uVar1 < 0x100) {
          uVar8 = uVar1;
        }
        local_150[-6] = (stbi_uc)uVar8;
        uVar1 = iVar17 - iVar14 >> 0x11;
        uVar8 = (uint)(byte)-(-1 < (int)uVar1);
        if (uVar1 < 0x100) {
          uVar8 = uVar1;
        }
        local_150[-1] = (stbi_uc)uVar8;
        uVar1 = iVar6 + iVar16 + 0x1010000 >> 0x11;
        uVar8 = (uint)(byte)-(-1 < (int)uVar1);
        if (uVar1 < 0x100) {
          uVar8 = uVar1;
        }
        local_150[-5] = (stbi_uc)uVar8;
        uVar1 = (iVar6 + 0x1010000) - iVar16 >> 0x11;
        uVar8 = (uint)(byte)-(-1 < (int)uVar1);
        if (uVar1 < 0x100) {
          uVar8 = uVar1;
        }
        local_150[-2] = (stbi_uc)uVar8;
        uVar1 = iVar4 + iVar13 + 0x1010000 >> 0x11;
        uVar8 = (uint)(byte)-(-1 < (int)uVar1);
        if (uVar1 < 0x100) {
          uVar8 = uVar1;
        }
        uVar9 = (iVar4 + 0x1010000) - iVar13 >> 0x11;
        uVar1 = (uint)(byte)-(-1 < (int)uVar9);
        if (uVar9 < 0x100) {
          uVar1 = uVar9;
        }
        local_150[-4] = (stbi_uc)uVar8;
        local_150[-3] = (stbi_uc)uVar1;
        local_150 = local_150 + out_stride;
      }
      return;
    }
    iVar10 = (int)data[lVar2 + -0x30];
    sVar3 = data[lVar2 + -0x28];
    if (sVar3 == 0 && data[lVar2 + -0x30] == 0) {
      if ((((data[lVar2 + -0x20] != 0) || (data[lVar2 + -0x18] != 0)) || (data[lVar2 + -0x10] != 0))
         || ((data[lVar2 + -8] != 0 || (data[lVar2] != 0)))) {
        sVar3 = 0;
        goto LAB_0010d320;
      }
      iVar10 = (int)data[lVar2 + -0x38] << 2;
      aiStack_148[lVar2 + 4] = iVar10;
      local_158[lVar2] = iVar10;
      aiStack_178[lVar2] = iVar10;
      aiStack_198[lVar2] = iVar10;
      aiStack_1b8[lVar2] = iVar10;
      aiStack_1d8[lVar2] = iVar10;
      aiStack_1f8[lVar2] = iVar10;
      aiStack_218[lVar2] = iVar10;
    }
    else {
LAB_0010d320:
      iVar14 = ((int)data[lVar2 + -8] + (int)sVar3) * 0x8a9;
      iVar11 = data[lVar2 + -8] * -0x1d8f + iVar14;
      iVar14 = sVar3 * 0xc3f + iVar14;
      iVar4 = (int)data[lVar2];
      iVar17 = (int)data[lVar2 + -0x10];
      iVar15 = (int)data[lVar2 + -0x20];
      iVar13 = (iVar17 + iVar10 + iVar15 + iVar4) * 0x12d0;
      iVar5 = (iVar4 + iVar10) * -0xe65 + iVar13;
      iVar13 = (iVar15 + iVar17) * -0x2901 + iVar13;
      iVar6 = (iVar17 + iVar10) * -0x63d;
      iVar7 = (iVar15 + iVar4) * -0x1f62;
      iVar16 = iVar15 * 0x312a + iVar7 + iVar13;
      iVar13 = iVar17 * 0x20da + iVar6 + iVar13;
      iVar17 = ((int)data[lVar2 + -0x18] + (int)data[lVar2 + -0x38]) * 0x1000;
      iVar15 = ((int)data[lVar2 + -0x38] - (int)data[lVar2 + -0x18]) * 0x1000;
      iVar6 = iVar10 * 0x1805 + iVar6 + iVar5;
      iVar5 = iVar4 * 0x4c7 + iVar7 + iVar5;
      iVar10 = iVar17 - iVar14;
      iVar14 = iVar17 + 0x200 + iVar14;
      iVar4 = iVar15 - iVar11;
      iVar11 = iVar15 + 0x200 + iVar11;
      aiStack_218[lVar2] = iVar6 + iVar14 >> 10;
      aiStack_148[lVar2 + 4] = iVar14 - iVar6 >> 10;
      aiStack_1f8[lVar2] = iVar16 + iVar11 >> 10;
      local_158[lVar2] = iVar11 - iVar16 >> 10;
      aiStack_1d8[lVar2] = iVar13 + iVar4 + 0x200 >> 10;
      aiStack_178[lVar2] = (iVar4 + 0x200) - iVar13 >> 10;
      aiStack_1b8[lVar2] = iVar10 + iVar5 + 0x200 >> 10;
      aiStack_198[lVar2] = (iVar10 + 0x200) - iVar5 >> 10;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

static void stbi__idct_block(stbi_uc *out, int out_stride, short data[64])
{
   int i,val[64],*v=val;
   stbi_uc *o;
   short *d = data;

   // columns
   for (i=0; i < 8; ++i,++d, ++v) {
      // if all zeroes, shortcut -- this avoids dequantizing 0s and IDCTing
      if (d[ 8]==0 && d[16]==0 && d[24]==0 && d[32]==0
           && d[40]==0 && d[48]==0 && d[56]==0) {
         //    no shortcut                 0     seconds
         //    (1|2|3|4|5|6|7)==0          0     seconds
         //    all separate               -0.047 seconds
         //    1 && 2|3 && 4|5 && 6|7:    -0.047 seconds
         int dcterm = d[0] << 2;
         v[0] = v[8] = v[16] = v[24] = v[32] = v[40] = v[48] = v[56] = dcterm;
      } else {
         STBI__IDCT_1D(d[ 0],d[ 8],d[16],d[24],d[32],d[40],d[48],d[56])
         // constants scaled things up by 1<<12; let's bring them back
         // down, but keep 2 extra bits of precision
         x0 += 512; x1 += 512; x2 += 512; x3 += 512;
         v[ 0] = (x0+t3) >> 10;
         v[56] = (x0-t3) >> 10;
         v[ 8] = (x1+t2) >> 10;
         v[48] = (x1-t2) >> 10;
         v[16] = (x2+t1) >> 10;
         v[40] = (x2-t1) >> 10;
         v[24] = (x3+t0) >> 10;
         v[32] = (x3-t0) >> 10;
      }
   }

   for (i=0, v=val, o=out; i < 8; ++i,v+=8,o+=out_stride) {
      // no fast case since the first 1D IDCT spread components out
      STBI__IDCT_1D(v[0],v[1],v[2],v[3],v[4],v[5],v[6],v[7])
      // constants scaled things up by 1<<12, plus we had 1<<2 from first
      // loop, plus horizontal and vertical each scale by sqrt(8) so together
      // we've got an extra 1<<3, so 1<<17 total we need to remove.
      // so we want to round that, which means adding 0.5 * 1<<17,
      // aka 65536. Also, we'll end up with -128 to 127 that we want
      // to encode as 0..255 by adding 128, so we'll add that before the shift
      x0 += 65536 + (128<<17);
      x1 += 65536 + (128<<17);
      x2 += 65536 + (128<<17);
      x3 += 65536 + (128<<17);
      // tried computing the shifts into temps, or'ing the temps to see
      // if any were out of range, but that was slower
      o[0] = stbi__clamp((x0+t3) >> 17);
      o[7] = stbi__clamp((x0-t3) >> 17);
      o[1] = stbi__clamp((x1+t2) >> 17);
      o[6] = stbi__clamp((x1-t2) >> 17);
      o[2] = stbi__clamp((x2+t1) >> 17);
      o[5] = stbi__clamp((x2-t1) >> 17);
      o[3] = stbi__clamp((x3+t0) >> 17);
      o[4] = stbi__clamp((x3-t0) >> 17);
   }
}